

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_adaptor_recover
              (secp256k1_context *ctx,uchar *deckey32,secp256k1_ecdsa_signature *sig,
              uchar *adaptor_sig162,secp256k1_pubkey *enckey)

{
  byte bVar1;
  byte bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  secp256k1_pubkey *psVar12;
  secp256k1_pubkey *psVar13;
  uint uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  size_t size;
  secp256k1_scalar adaptor_sigr;
  secp256k1_scalar sp;
  secp256k1_scalar deckey;
  secp256k1_scalar s;
  uchar enckey_expected33 [33];
  uchar enckey33 [33];
  secp256k1_ge enckey_expected_ge;
  secp256k1_gej enckey_expected_gej;
  size_t local_200;
  uchar *local_1f8;
  secp256k1_pubkey *local_1f0;
  secp256k1_scalar local_1e8;
  secp256k1_scalar local_1c8;
  secp256k1_scalar local_1a8;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  byte local_168 [48];
  byte local_138 [48];
  secp256k1_ge local_108;
  secp256k1_gej local_b0;
  
  local_200 = 0x21;
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_ecdsa_adaptor_recover_cold_1();
    uVar14 = 0;
  }
  else {
    uVar15 = 0;
    iVar8 = secp256k1_ecdsa_adaptor_sig_deserialize
                      ((secp256k1_ge *)0x0,&local_1e8,(secp256k1_ge *)0x0,&local_1c8,
                       (secp256k1_scalar *)0x0,(secp256k1_scalar *)0x0,adaptor_sig162);
    uVar14 = 0;
    if (iVar8 != 0) {
      uVar6 = *(undefined8 *)(sig->data + 0x20);
      uVar7 = *(undefined8 *)(sig->data + 0x30);
      uVar10 = local_1e8.d[0] ^ *(ulong *)sig->data;
      uVar3 = *(uint64_t *)(sig->data + 8);
      uVar4 = *(uint64_t *)(sig->data + 0x10);
      uVar5 = *(uint64_t *)(sig->data + 0x18);
      local_188._0_4_ = (undefined4)uVar6;
      local_188._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
      local_188._8_4_ = (undefined4)*(undefined8 *)(sig->data + 0x28);
      local_188._12_4_ = (undefined4)((ulong)*(undefined8 *)(sig->data + 0x28) >> 0x20);
      local_178._0_4_ = (undefined4)uVar7;
      local_178._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_178._8_4_ = (undefined4)*(undefined8 *)(sig->data + 0x38);
      local_178._12_4_ = (undefined4)((ulong)*(undefined8 *)(sig->data + 0x38) >> 0x20);
      auVar16._0_4_ = -(uint)(local_188._0_4_ == 0 && local_178._0_4_ == 0);
      auVar16._4_4_ = -(uint)(local_188._4_4_ == 0 && local_178._4_4_ == 0);
      auVar16._8_4_ = -(uint)(local_188._8_4_ == 0 && local_178._8_4_ == 0);
      auVar16._12_4_ = -(uint)(local_188._12_4_ == 0 && local_178._12_4_ == 0);
      iVar8 = movmskps((int)uVar10,auVar16);
      local_1f8 = deckey32;
      local_1f0 = enckey;
      local_188 = *(undefined1 (*) [16])(sig->data + 0x20);
      local_178 = *(undefined1 (*) [16])(sig->data + 0x30);
      secp256k1_scalar_inverse(&local_1a8,(secp256k1_scalar *)local_188);
      secp256k1_scalar_mul(&local_1a8,&local_1a8,&local_1c8);
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_b0,&local_1a8);
      secp256k1_ge_set_gej(&local_108,&local_b0);
      iVar9 = secp256k1_eckey_pubkey_serialize(&local_108,local_168,&local_200,0x102);
      uVar14 = uVar15;
      if (iVar9 != 0) {
        psVar12 = local_1f0;
        iVar9 = secp256k1_ec_pubkey_serialize(ctx,local_138,&local_200,local_1f0,0x102);
        if (iVar9 != 0) {
          lVar11 = 1;
          do {
            psVar13 = (secp256k1_pubkey *)((ulong)psVar12 & 0xffffffff);
            bVar1 = local_168[lVar11];
            bVar2 = local_138[lVar11];
            psVar12 = (secp256k1_pubkey *)(ulong)((uint)bVar1 - (uint)bVar2);
            if (bVar1 == bVar2) {
              psVar12 = psVar13;
            }
            iVar9 = (int)psVar12;
            if (bVar1 != bVar2) goto LAB_001182c1;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x21);
          iVar9 = 0;
LAB_001182c1:
          if (iVar9 == 0) {
            if (local_168[0] != local_138[0]) {
              secp256k1_scalar_negate(&local_1a8,&local_1a8);
            }
            secp256k1_scalar_get_b32(local_1f8,&local_1a8);
            uVar14 = (uint)((local_1e8.d[3] == uVar5 &&
                            (local_1e8.d[2] == uVar4 && (local_1e8.d[1] == uVar3 && uVar10 == 0)))
                           && iVar8 != 0xf);
          }
        }
      }
    }
  }
  return uVar14;
}

Assistant:

int secp256k1_ecdsa_adaptor_recover(const secp256k1_context* ctx, unsigned char *deckey32, const secp256k1_ecdsa_signature *sig, const unsigned char *adaptor_sig162, const secp256k1_pubkey *enckey) {
    secp256k1_scalar sp, adaptor_sigr;
    secp256k1_scalar s, r;
    secp256k1_scalar deckey;
    secp256k1_ge enckey_expected_ge;
    secp256k1_gej enckey_expected_gej;
    unsigned char enckey33[33];
    unsigned char enckey_expected33[33];
    size_t size = 33;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(deckey32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(enckey != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &adaptor_sigr, NULL, &sp, NULL, NULL, adaptor_sig162)) {
        return 0;
    }
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    /* Check that we're not looking at some unrelated signature */
    ret &= secp256k1_scalar_eq(&adaptor_sigr, &r);
    /* y = s⁻¹ * s' */
    ret &= !secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_inverse(&deckey, &s);
    secp256k1_scalar_mul(&deckey, &deckey, &sp);

    /* Deal with ECDSA malleability */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &enckey_expected_gej, &deckey);
    secp256k1_ge_set_gej(&enckey_expected_ge, &enckey_expected_gej);
    /* We declassify non-secret enckey_expected_ge to allow using it as a
     * branch point. */
    secp256k1_declassify(ctx, &enckey_expected_ge, sizeof(enckey_expected_ge));
    if (!secp256k1_eckey_pubkey_serialize(&enckey_expected_ge, enckey_expected33, &size, SECP256K1_EC_COMPRESSED)) {
        /* Unreachable from tests (and other VERIFY builds) and therefore this
         * branch should be ignored in test coverage analysis.
         *
         * Proof:
         *     eckey_pubkey_serialize fails <=> deckey = 0
         *     deckey = 0 <=> s^-1 = 0 or sp = 0
         *     case 1: s^-1 = 0 impossible by the definition of multiplicative
         *             inverse and because the scalar_inverse implementation
         *             VERIFY_CHECKs that the inputs are valid scalars.
         *     case 2: sp = 0 impossible because ecdsa_adaptor_sig_deserialize would have already failed
         */
        return 0;
    }
    if (!secp256k1_ec_pubkey_serialize(ctx, enckey33, &size, enckey, SECP256K1_EC_COMPRESSED)) {
        return 0;
    }
    if (secp256k1_memcmp_var(&enckey_expected33[1], &enckey33[1], 32) != 0) {
        return 0;
    }
    if (enckey_expected33[0] != enckey33[0]) {
        /* try Y_implied == -Y */
        secp256k1_scalar_negate(&deckey, &deckey);
    }
    secp256k1_scalar_get_b32(deckey32, &deckey);

    secp256k1_scalar_clear(&deckey);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return ret;
}